

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIO.cpp
# Opt level: O2

void __thiscall Imf_2_5::IStream::~IStream(IStream *this)

{
  this->_vptr_IStream = (_func_int **)&PTR__IStream_02f9c700;
  std::__cxx11::string::~string((string *)&this->_fileName);
  return;
}

Assistant:

IStream::~IStream ()
{
    // empty
}